

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
mxx::impl::
sample_arbit_decomp<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,impl *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,comm *end,
          size_t param_5)

{
  int iVar1;
  int iVar2;
  unsigned_long *puVar3;
  unsigned_long uVar4;
  size_type sVar5;
  reference piVar6;
  reference pvVar7;
  comm *pcVar8;
  iterator iVar9;
  iterator iVar10;
  reference pvVar11;
  allocator<unsigned_long> local_f1;
  value_type_conflict local_f0;
  undefined1 local_e8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_sizes;
  value_type my_splitter;
  size_t bucket_size;
  size_t i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> pos;
  undefined1 local_90 [8];
  vector<int,_std::allocator<int>_> local_splitters;
  ulong local_70;
  unsigned_long local_68;
  size_t local_s;
  unsigned_long uStack_58;
  int p;
  size_t total_size;
  impl *local_48;
  ulong local_40;
  size_t local_size;
  comm *comm_local;
  size_t s_local;
  int *local_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin_local;
  vector<int,_std::allocator<int>_> *result_splitters;
  
  total_size = (size_t)begin._M_current;
  local_48 = this;
  local_size = param_5;
  comm_local = end;
  local_20 = begin._M_current;
  end_local._M_current = (int *)this;
  local_40 = std::distance<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this,
                        begin);
  uStack_58 = allreduce<unsigned_long>(&local_40,(comm *)local_size);
  local_s._4_4_ = mxx::comm::size((comm *)local_size);
  if (local_40 == 0) {
    local_68 = 0;
  }
  else {
    local_70 = ((local_40 * (long)comm_local * (long)local_s._4_4_ + uStack_58) - 1) / uStack_58;
    local_splitters.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x1;
    puVar3 = std::max<unsigned_long>
                       (&local_70,
                        (unsigned_long *)
                        &local_splitters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    local_68 = *puVar3;
  }
  uVar4 = allreduce<unsigned_long>(&local_68,(comm *)local_size);
  if (uVar4 < (ulong)((long)local_s._4_4_ * (long)comm_local)) {
    assert_fail("mxx::allreduce(local_s, comm) >= p*s",
                "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
                ,0x71,"sample_arbit_decomp");
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_90);
  if (local_68 != 0) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)local_90,local_68);
    i = (size_t)end_local._M_current;
    for (bucket_size = 0;
        sVar5 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_90), bucket_size < sVar5;
        bucket_size = bucket_size + 1) {
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+=
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&i,
                 local_40 / (local_68 + 1) +
                 (long)(int)(uint)(bucket_size < local_40 % (local_68 + 1)) + -1);
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&i);
      iVar1 = *piVar6;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_90,bucket_size);
      *pvVar7 = iVar1;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&i);
    }
  }
  distribute_inplace<int>((vector<int,_std::allocator<int>_> *)local_90,(comm *)local_size);
  pcVar8 = (comm *)std::vector<int,_std::allocator<int>_>::size
                             ((vector<int,_std::allocator<int>_> *)local_90);
  if (pcVar8 != comm_local) {
    pcVar8 = (comm *)std::vector<int,_std::allocator<int>_>::size
                               ((vector<int,_std::allocator<int>_> *)local_90);
    if (pcVar8 <= comm_local) {
      assert_fail("local_splitters.size() > s",
                  "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
                  ,0x89,"sample_arbit_decomp");
    }
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)local_90,(size_type)comm_local);
  }
  iVar9 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_90);
  iVar10 = std::vector<int,_std::allocator<int>_>::end
                     ((vector<int,_std::allocator<int>_> *)local_90);
  bitonic_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
            (iVar9._M_current,iVar10._M_current,local_size);
  pvVar7 = std::vector<int,_std::allocator<int>_>::back
                     ((vector<int,_std::allocator<int>_> *)local_90);
  recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = *pvVar7;
  iVar1 = mxx::comm::size((comm *)local_size);
  local_f0 = 1;
  std::allocator<unsigned_long>::allocator(&local_f1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e8,(long)iVar1,&local_f0
             ,&local_f1);
  std::allocator<unsigned_long>::~allocator(&local_f1);
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e8);
  *pvVar11 = 0;
  iVar1 = mxx::comm::rank((comm *)local_size);
  iVar2 = mxx::comm::size((comm *)local_size);
  allgatherv<int>(__return_storage_ptr__,
                  (int *)&recv_sizes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(ulong)(iVar1 + 1 < iVar2),
                  (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e8,
                  (comm *)local_size);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_90);
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename std::iterator_traits<_Iterator>::value_type>
sample_arbit_decomp(_Iterator begin, _Iterator end, _Compare comp, size_t s, const mxx::comm& comm) {
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;
    size_t local_size = std::distance(begin, end);

    // get total size n
    size_t total_size = mxx::allreduce(local_size, comm);

    // p = number of processes
    int p = comm.size();

    //  pick a total of s*p samples, thus locally pick ceil((local_size/n)*s*p)
    //  and at least one samples from each processor.
    //  this will result in at least s*p samples.
    size_t local_s;
    if (local_size == 0)
        local_s = 0;
    else
        local_s = std::max<size_t>(((local_size*s*p)+total_size-1)/total_size, 1);

    MXX_ASSERT(mxx::allreduce(local_s, comm) >= p*s);

    // init samples
    std::vector<value_type> local_splitters;

    // pick local samples
    if (local_s > 0) {
        local_splitters.resize(local_s);
        _Iterator pos = begin;
        for (size_t i = 0; i < local_splitters.size(); ++i)
        {
            size_t bucket_size = local_size / (local_s+1) + (i < (local_size % (local_s+1)) ? 1 : 0);
            // pick last element of each bucket
            pos += (bucket_size-1);
            local_splitters[i] = *pos;
            ++pos;
        }
    }

    // distribute elements equally
    mxx::distribute_inplace(local_splitters, comm);

    // discard extra splitters, to make it even
    if (local_splitters.size() != s) {
        MXX_ASSERT(local_splitters.size() > s);
        local_splitters.resize(s);
    }

    // sort splitters using parallel bitonic sort
    bitonic_sort(local_splitters.begin(), local_splitters.end(), comp, comm);

    // select the last element on each process but the last
    value_type my_splitter = local_splitters.back();
    // allgather splitters (from all but the last processor)
    std::vector<size_t> recv_sizes(comm.size(), 1);
    recv_sizes.back() = 0;
    std::vector<value_type> result_splitters = mxx::allgatherv(&my_splitter, (comm.rank() + 1 < comm.size()) ? 1 : 0, recv_sizes, comm);

    // return resulting splitters
    return result_splitters;
}